

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ssize_t ossl_send(connectdata *conn,int sockindex,void *mem,size_t len,CURLcode *curlcode)

{
  uint err_00;
  Curl_easy *pCVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  uint *puVar5;
  int local_1ec;
  char local_1e8 [8];
  char ver [120];
  int sockerr;
  ssl_connect_data *connssl;
  int rc;
  int memlen;
  unsigned_long sslerror;
  char error_buffer [256];
  int err;
  CURLcode *curlcode_local;
  size_t len_local;
  void *mem_local;
  int sockindex_local;
  connectdata *conn_local;
  
  ERR_clear_error();
  if (len < 0x80000000) {
    local_1ec = (int)len;
  }
  else {
    local_1ec = 0x7fffffff;
  }
  iVar2 = SSL_write((SSL *)(conn->ssl[sockindex].backend)->handle,mem,local_1ec);
  if (iVar2 < 1) {
    iVar2 = SSL_get_error((SSL *)(conn->ssl[sockindex].backend)->handle,iVar2);
    if (iVar2 == 1) {
      uVar3 = ERR_get_error();
      iVar2 = ERR_GET_LIB(uVar3);
      if ((((iVar2 == 0x14) && (iVar2 = ERR_GET_REASON(uVar3), iVar2 == 0x80)) &&
          (conn->ssl[sockindex].state == ssl_connection_complete)) &&
         (conn->proxy_ssl[sockindex].state == ssl_connection_complete)) {
        Curl_ossl_version(local_1e8,0x78);
        Curl_failf(conn->data,"Error: %s does not support double SSL tunneling.",local_1e8);
      }
      else {
        pCVar1 = conn->data;
        pcVar4 = ossl_strerror(uVar3,(char *)&sslerror,0x100);
        Curl_failf(pCVar1,"SSL_write() error: %s",pcVar4);
      }
      *curlcode = CURLE_SEND_ERROR;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
    else if (iVar2 - 2U < 2) {
      *curlcode = CURLE_AGAIN;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
    else if (iVar2 == 5) {
      puVar5 = (uint *)__errno_location();
      err_00 = *puVar5;
      uVar3 = ERR_get_error();
      if (uVar3 == 0) {
        if (err_00 == 0) {
          pcVar4 = SSL_ERROR_to_str(5);
          strncpy((char *)&sslerror,pcVar4,0x100);
          error_buffer[0xf7] = '\0';
        }
        else {
          Curl_strerror(err_00,(char *)&sslerror,0x100);
        }
      }
      else {
        ossl_strerror(uVar3,(char *)&sslerror,0x100);
      }
      Curl_failf(conn->data,"OpenSSL SSL_write: %s, errno %d",&sslerror,(ulong)err_00);
      *curlcode = CURLE_SEND_ERROR;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
    else {
      pCVar1 = conn->data;
      pcVar4 = SSL_ERROR_to_str(iVar2);
      puVar5 = (uint *)__errno_location();
      Curl_failf(pCVar1,"OpenSSL SSL_write: %s, errno %d",pcVar4,(ulong)*puVar5);
      *curlcode = CURLE_SEND_ERROR;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
  }
  else {
    *curlcode = CURLE_OK;
    conn_local = (connectdata *)(long)iVar2;
  }
  return (ssize_t)conn_local;
}

Assistant:

static ssize_t ossl_send(struct connectdata *conn,
                         int sockindex,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  unsigned long sslerror;
  int memlen;
  int rc;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];

  ERR_clear_error();

  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  rc = SSL_write(BACKEND->handle, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(BACKEND->handle, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* The operation did not complete; the same TLS/SSL I/O function
         should be called again later. This is basically an EWOULDBLOCK
         equivalent. */
      *curlcode = CURLE_AGAIN;
      return -1;
    case SSL_ERROR_SYSCALL:
      {
        int sockerr = SOCKERRNO;
        sslerror = ERR_get_error();
        if(sslerror)
          ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
        else if(sockerr)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else {
          strncpy(error_buffer, SSL_ERROR_to_str(err), sizeof(error_buffer));
          error_buffer[sizeof(error_buffer) - 1] = '\0';
        }
        failf(conn->data, OSSL_PACKAGE " SSL_write: %s, errno %d",
              error_buffer, sockerr);
        *curlcode = CURLE_SEND_ERROR;
        return -1;
      }
    case SSL_ERROR_SSL:
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      if(ERR_GET_LIB(sslerror) == ERR_LIB_SSL &&
         ERR_GET_REASON(sslerror) == SSL_R_BIO_NOT_SET &&
         conn->ssl[sockindex].state == ssl_connection_complete &&
         conn->proxy_ssl[sockindex].state == ssl_connection_complete) {
        char ver[120];
        Curl_ossl_version(ver, 120);
        failf(conn->data, "Error: %s does not support double SSL tunneling.",
              ver);
      }
      else
        failf(conn->data, "SSL_write() error: %s",
              ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    }
    /* a true error */
    failf(conn->data, OSSL_PACKAGE " SSL_write: %s, errno %d",
          SSL_ERROR_to_str(err), SOCKERRNO);
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  *curlcode = CURLE_OK;
  return (ssize_t)rc; /* number of bytes */
}